

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O1

void __thiscall Prog::~Prog(Prog *this)

{
  ~Prog(this);
  operator_delete(this,0x1318);
  return;
}

Assistant:

virtual ~Prog() {}